

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

qsizetype QtPrivate::findString
                    (QStringView haystack0,qsizetype from,QStringView needle0,CaseSensitivity cs)

{
  char16_t *pcVar1;
  char16_t cVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  char16_t *pcVar6;
  long lVar7;
  byte bVar8;
  char16_t *pcVar9;
  ulong uVar10;
  int iVar11;
  char16_t *pcVar12;
  uint uVar13;
  char16_t *pcVar14;
  long lVar15;
  ulong alen;
  long lVar16;
  uint uVar17;
  short sVar18;
  bool bVar19;
  uint uVar20;
  char16_t *pcVar21;
  long lVar22;
  long in_FS_OFFSET;
  QStringView str;
  QStringView str_00;
  uchar skiptable [256];
  uchar local_138 [256];
  long local_38;
  
  alen = needle0.m_size;
  pcVar6 = needle0.m_data;
  uVar10 = haystack0.m_size;
  pcVar14 = haystack0.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (alen == 1) {
    pcVar21 = (char16_t *)0xffffffffffffffff;
    if (-from == uVar10 || (long)-uVar10 < from) {
      lVar16 = 0;
      if (0 < (long)(from + uVar10)) {
        lVar16 = from + uVar10;
      }
      if (-1 < from) {
        lVar16 = from;
      }
      if (lVar16 < (long)uVar10) {
        cVar2 = *pcVar6;
        str.m_data = (long)(uVar10 * 2 + lVar16 * -2) >> 1;
        if (cs == CaseSensitive) {
          str.m_size._0_2_ = cVar2;
          str.m_size._2_6_ = 0;
          pcVar6 = qustrchr((QtPrivate *)(pcVar14 + lVar16),str,cVar2);
        }
        else {
          str_00.m_size._0_2_ = cVar2;
          str_00.m_data = (storage_type_conflict *)str.m_data;
          str_00.m_size._2_6_ = 0;
          pcVar6 = qustrcasechr((QtPrivate *)(pcVar14 + lVar16),str_00,cVar2);
        }
        if (pcVar6 != pcVar14 + uVar10) {
          pcVar21 = (char16_t *)((long)pcVar6 - (long)pcVar14 >> 1);
        }
      }
    }
  }
  else {
    pcVar12 = (char16_t *)((from >> 0x3f & uVar10) + from);
    pcVar21 = (char16_t *)0xffffffffffffffff;
    if ((((long)pcVar12 + alen <= uVar10) && (pcVar21 = pcVar12, alen != 0)) &&
       (pcVar21 = (char16_t *)0xffffffffffffffff, uVar10 != 0)) {
      if ((long)alen < 6 || (long)uVar10 < 0x1f5) {
        pcVar21 = pcVar14 + (long)pcVar12;
        lVar16 = uVar10 - alen;
        pcVar1 = pcVar14 + lVar16;
        bVar8 = (byte)(alen - 1);
        if (cs == CaseSensitive) {
          if ((long)alen < 1) {
            lVar15 = 0;
            lVar22 = 0;
          }
          else {
            lVar22 = 0;
            lVar15 = 0;
            uVar10 = 0;
            do {
              lVar22 = (ulong)(ushort)pcVar6[uVar10] + lVar22 * 2;
              lVar15 = (ulong)(ushort)pcVar21[uVar10] + lVar15 * 2;
              uVar10 = uVar10 + 1;
            } while (alen != uVar10);
          }
          if ((long)pcVar12 <= lVar16) {
            lVar15 = lVar15 - (ulong)(ushort)pcVar21[alen - 1];
            do {
              lVar15 = (ulong)(ushort)pcVar21[alen - 1] + lVar15;
              if (lVar15 == lVar22) {
                uVar10 = 0;
                do {
                  iVar11 = (uint)(ushort)pcVar6[uVar10] - (uint)(ushort)pcVar21[uVar10];
                  if (pcVar6[uVar10] != pcVar21[uVar10]) goto LAB_001280b3;
                  uVar10 = uVar10 + 1;
                } while (alen != uVar10);
                iVar11 = 0;
LAB_001280b3:
                if (iVar11 == 0) {
                  pcVar21 = (char16_t *)((long)pcVar21 - (long)pcVar14 >> 1);
                  goto LAB_001283e3;
                }
              }
              if (alen < 0x41) {
                lVar15 = lVar15 - ((ulong)(ushort)*pcVar21 << (bVar8 & 0x3f));
              }
              lVar15 = lVar15 * 2;
              pcVar21 = pcVar21 + 1;
            } while (pcVar21 <= pcVar1);
          }
        }
        else {
          if ((long)alen < 1) {
            lVar22 = 0;
            lVar15 = 0;
          }
          else {
            lVar7 = 0;
            lVar15 = 0;
            lVar22 = 0;
            uVar10 = alen;
            do {
              uVar3 = *(ushort *)((long)pcVar6 + lVar7);
              uVar17 = (uint)uVar3;
              if ((lVar7 != 0 && (uVar3 & 0xfc00) == 0xdc00) &&
                 (uVar4 = *(ushort *)((long)pcVar6 + lVar7 + -2), (uVar4 & 0xfc00) == 0xd800)) {
                uVar17 = (uint)uVar3 + (uint)uVar4 * 0x400 + 0xfca02400;
              }
              uVar13 = 0xff;
              if (uVar17 < 0x11000) {
                uVar13 = 0x1f;
              }
              uVar20 = uVar17 >> 5;
              if (0x10fff < uVar17) {
                uVar20 = (uVar17 - 0x11000 >> 8) + 0x880;
              }
              sVar18 = (short)((uint)(int)(short)*(ushort *)
                                                  (QUnicodeTables::uc_properties +
                                                  (ulong)*(ushort *)
                                                          (QUnicodeTables::uc_property_trie +
                                                          (ulong)((uVar13 & uVar17) +
                                                                 (uint)*(ushort *)
                                                                        (QUnicodeTables::
                                                                         uc_property_trie +
                                                                        (ulong)uVar20 * 2)) * 2) *
                                                  0x14 + 0xe) >> 1);
              if ((*(ushort *)
                    (QUnicodeTables::uc_properties +
                    (ulong)*(ushort *)
                            (QUnicodeTables::uc_property_trie +
                            (ulong)((uVar13 & uVar17) +
                                   (uint)*(ushort *)
                                          (QUnicodeTables::uc_property_trie + (ulong)uVar20 * 2)) *
                            2) * 0x14 + 0xe) & 1) == 0) {
                uVar17 = uVar17 + (int)sVar18;
              }
              else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar18 * 2) == 1) {
                uVar17 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar18 * 2 + 2);
              }
              uVar3 = *(ushort *)((long)pcVar21 + lVar7);
              uVar13 = (uint)uVar3;
              if ((pcVar14 < (char16_t *)(lVar7 + (long)pcVar21) && (uVar3 & 0xfc00) == 0xdc00) &&
                 (uVar4 = *(ushort *)((long)pcVar21 + lVar7 + -2), (uVar4 & 0xfc00) == 0xd800)) {
                uVar13 = (uint)uVar3 + (uint)uVar4 * 0x400 + 0xfca02400;
              }
              uVar20 = 0xff;
              if (uVar13 < 0x11000) {
                uVar20 = 0x1f;
              }
              uVar5 = uVar13 >> 5;
              if (0x10fff < uVar13) {
                uVar5 = (uVar13 - 0x11000 >> 8) + 0x880;
              }
              sVar18 = (short)((uint)(int)(short)*(ushort *)
                                                  (QUnicodeTables::uc_properties +
                                                  (ulong)*(ushort *)
                                                          (QUnicodeTables::uc_property_trie +
                                                          (ulong)((uVar20 & uVar13) +
                                                                 (uint)*(ushort *)
                                                                        (QUnicodeTables::
                                                                         uc_property_trie +
                                                                        (ulong)uVar5 * 2)) * 2) *
                                                  0x14 + 0xe) >> 1);
              if ((*(ushort *)
                    (QUnicodeTables::uc_properties +
                    (ulong)*(ushort *)
                            (QUnicodeTables::uc_property_trie +
                            (ulong)((uVar20 & uVar13) +
                                   (uint)*(ushort *)
                                          (QUnicodeTables::uc_property_trie + (ulong)uVar5 * 2)) * 2
                            ) * 0x14 + 0xe) & 1) == 0) {
                uVar13 = uVar13 + (int)sVar18;
              }
              else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar18 * 2) == 1) {
                uVar13 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar18 * 2 + 2);
              }
              lVar15 = lVar15 * 2 + (ulong)uVar17;
              lVar22 = lVar22 * 2 + (ulong)uVar13;
              lVar7 = lVar7 + 2;
              uVar10 = uVar10 - 1;
            } while (uVar10 != 0);
          }
          pcVar9 = pcVar21 + (alen - 1);
          cVar2 = *pcVar9;
          uVar17 = (uint)(ushort)cVar2;
          if ((pcVar14 < pcVar9 && ((ushort)cVar2 & 0xfc00) == 0xdc00) &&
             ((pcVar9[-1] & 0xfc00U) == 0xd800)) {
            uVar17 = (uint)(ushort)cVar2 + (uint)(ushort)pcVar9[-1] * 0x400 + 0xfca02400;
          }
          uVar13 = 0xff;
          if (uVar17 < 0x11000) {
            uVar13 = 0x1f;
          }
          uVar20 = uVar17 >> 5;
          if (0x10fff < uVar17) {
            uVar20 = (uVar17 - 0x11000 >> 8) + 0x880;
          }
          sVar18 = (short)((uint)(int)(short)*(ushort *)
                                              (QUnicodeTables::uc_properties +
                                              (ulong)*(ushort *)
                                                      (QUnicodeTables::uc_property_trie +
                                                      (ulong)((uVar13 & uVar17) +
                                                             (uint)*(ushort *)
                                                                    (QUnicodeTables::
                                                                     uc_property_trie +
                                                                    (ulong)uVar20 * 2)) * 2) * 0x14
                                              + 0xe) >> 1);
          if ((*(ushort *)
                (QUnicodeTables::uc_properties +
                (ulong)*(ushort *)
                        (QUnicodeTables::uc_property_trie +
                        (ulong)((uVar13 & uVar17) +
                               (uint)*(ushort *)
                                      (QUnicodeTables::uc_property_trie + (ulong)uVar20 * 2)) * 2) *
                0x14 + 0xe) & 1) == 0) {
            uVar17 = uVar17 + (int)sVar18;
          }
          else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar18 * 2) == 1) {
            uVar17 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar18 * 2 + 2);
          }
          bVar19 = lVar16 < (long)pcVar12;
          if ((long)pcVar12 <= lVar16) {
            lVar22 = lVar22 - (ulong)uVar17;
            lVar16 = (long)pcVar12 * 2;
            lVar7 = alen * 2 + -2;
            do {
              uVar3 = *(ushort *)((long)pcVar14 + lVar16 + lVar7);
              uVar17 = (uint)uVar3;
              if ((pcVar14 < (char16_t *)((long)pcVar14 + lVar16 + lVar7) &&
                   (uVar3 & 0xfc00) == 0xdc00) &&
                 (uVar4 = *(ushort *)((long)pcVar14 + lVar16 + alen * 2 + -4),
                 (uVar4 & 0xfc00) == 0xd800)) {
                uVar17 = (uint)uVar3 + (uint)uVar4 * 0x400 + 0xfca02400;
              }
              uVar13 = 0xff;
              if (uVar17 < 0x11000) {
                uVar13 = 0x1f;
              }
              uVar20 = uVar17 >> 5;
              if (0x10fff < uVar17) {
                uVar20 = (uVar17 - 0x11000 >> 8) + 0x880;
              }
              sVar18 = (short)((uint)(int)(short)*(ushort *)
                                                  (QUnicodeTables::uc_properties +
                                                  (ulong)*(ushort *)
                                                          (QUnicodeTables::uc_property_trie +
                                                          (ulong)((uVar13 & uVar17) +
                                                                 (uint)*(ushort *)
                                                                        (QUnicodeTables::
                                                                         uc_property_trie +
                                                                        (ulong)uVar20 * 2)) * 2) *
                                                  0x14 + 0xe) >> 1);
              if ((*(ushort *)
                    (QUnicodeTables::uc_properties +
                    (ulong)*(ushort *)
                            (QUnicodeTables::uc_property_trie +
                            (ulong)((uVar13 & uVar17) +
                                   (uint)*(ushort *)
                                          (QUnicodeTables::uc_property_trie + (ulong)uVar20 * 2)) *
                            2) * 0x14 + 0xe) & 1) == 0) {
                uVar17 = uVar17 + (int)sVar18;
              }
              else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar18 * 2) == 1) {
                uVar17 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar18 * 2 + 2);
              }
              pcVar12 = (char16_t *)((long)pcVar14 + lVar16);
              lVar22 = lVar22 + (ulong)uVar17;
              if ((lVar22 == lVar15) &&
                 (iVar11 = ucstricmp(alen,pcVar6,alen,pcVar12),
                 pcVar21 = (char16_t *)QUnicodeTables::uc_property_trie, iVar11 == 0)) {
                pcVar21 = (char16_t *)(lVar16 >> 1);
                break;
              }
              if (alen < 0x41) {
                cVar2 = *pcVar12;
                uVar17 = (uint)(ushort)cVar2;
                if ((pcVar14 < pcVar12 && ((ushort)cVar2 & 0xfc00) == 0xdc00) &&
                   (uVar3 = *(ushort *)((long)pcVar14 + lVar16 + -2), (uVar3 & 0xfc00) == 0xd800)) {
                  uVar17 = (uint)(ushort)cVar2 + (uint)uVar3 * 0x400 + 0xfca02400;
                }
                uVar13 = 0xff;
                if (uVar17 < 0x11000) {
                  uVar13 = 0x1f;
                }
                uVar20 = uVar17 >> 5;
                if (0x10fff < uVar17) {
                  uVar20 = (uVar17 - 0x11000 >> 8) + 0x880;
                }
                sVar18 = (short)((uint)(int)(short)*(ushort *)
                                                    (QUnicodeTables::uc_properties +
                                                    (ulong)*(ushort *)
                                                            (QUnicodeTables::uc_property_trie +
                                                            (ulong)((uVar13 & uVar17) +
                                                                   (uint)*(ushort *)
                                                                          (QUnicodeTables::
                                                                           uc_property_trie +
                                                                          (ulong)uVar20 * 2)) * 2) *
                                                    0x14 + 0xe) >> 1);
                if ((*(ushort *)
                      (QUnicodeTables::uc_properties +
                      (ulong)*(ushort *)
                              (QUnicodeTables::uc_property_trie +
                              (ulong)((uVar13 & uVar17) +
                                     (uint)*(ushort *)
                                            (QUnicodeTables::uc_property_trie + (ulong)uVar20 * 2))
                              * 2) * 0x14 + 0xe) & 1) == 0) {
                  uVar17 = uVar17 + (int)sVar18;
                }
                else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar18 * 2) == 1) {
                  uVar17 = (uint)*(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar18 * 2 + 2);
                }
                lVar22 = lVar22 - ((ulong)uVar17 << (bVar8 & 0x3f));
              }
              lVar22 = lVar22 * 2;
              pcVar12 = (char16_t *)((long)pcVar14 + lVar16 + 2);
              lVar16 = lVar16 + 2;
              bVar19 = pcVar1 < pcVar12;
            } while (pcVar12 <= pcVar1);
          }
          if (!bVar19) goto LAB_001283e3;
        }
        pcVar21 = (char16_t *)0xffffffffffffffff;
      }
      else {
        memset(local_138,0xaa,0x100);
        bm_init_skiptable(needle0,local_138,cs);
        pcVar6 = (char16_t *)0x0;
        if (0 < (long)pcVar12) {
          pcVar6 = pcVar12;
        }
        pcVar21 = (char16_t *)bm_find(haystack0,(qsizetype)pcVar6,needle0,local_138,cs);
      }
    }
  }
LAB_001283e3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (qsizetype)pcVar21;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::findString(QStringView haystack0, qsizetype from, QStringView needle0, Qt::CaseSensitivity cs) noexcept
{
    const qsizetype l = haystack0.size();
    const qsizetype sl = needle0.size();
    if (sl == 1)
        return findString(haystack0, from, needle0[0], cs);
    if (from < 0)
        from += l;
    if (std::size_t(sl + from) > std::size_t(l))
        return -1;
    if (!sl)
        return from;
    if (!l)
        return -1;

    /*
        We use the Boyer-Moore algorithm in cases where the overhead
        for the skip table should pay off, otherwise we use a simple
        hash function.
    */
    if (l > 500 && sl > 5)
        return qFindStringBoyerMoore(haystack0, from, needle0, cs);

    auto sv = [sl](const char16_t *v) { return QStringView(v, sl); };
    /*
        We use some hashing for efficiency's sake. Instead of
        comparing strings, we compare the hash value of str with that
        of a part of this QString. Only if that matches, we call
        qt_string_compare().
    */
    const char16_t *needle = needle0.utf16();
    const char16_t *haystack = haystack0.utf16() + from;
    const char16_t *end = haystack0.utf16() + (l - sl);
    const qregisteruint sl_minus_1 = sl - 1;
    qregisteruint hashNeedle = 0, hashHaystack = 0;
    qsizetype idx;

    if (cs == Qt::CaseSensitive) {
        for (idx = 0; idx < sl; ++idx) {
            hashNeedle = ((hashNeedle<<1) + needle[idx]);
            hashHaystack = ((hashHaystack<<1) + haystack[idx]);
        }
        hashHaystack -= haystack[sl_minus_1];

        while (haystack <= end) {
            hashHaystack += haystack[sl_minus_1];
            if (hashHaystack == hashNeedle
                 && QtPrivate::compareStrings(needle0, sv(haystack), Qt::CaseSensitive) == 0)
                return haystack - haystack0.utf16();

            REHASH(*haystack);
            ++haystack;
        }
    } else {
        const char16_t *haystack_start = haystack0.utf16();
        for (idx = 0; idx < sl; ++idx) {
            hashNeedle = (hashNeedle<<1) + foldCase(needle + idx, needle);
            hashHaystack = (hashHaystack<<1) + foldCase(haystack + idx, haystack_start);
        }
        hashHaystack -= foldCase(haystack + sl_minus_1, haystack_start);

        while (haystack <= end) {
            hashHaystack += foldCase(haystack + sl_minus_1, haystack_start);
            if (hashHaystack == hashNeedle
                 && QtPrivate::compareStrings(needle0, sv(haystack), Qt::CaseInsensitive) == 0)
                return haystack - haystack0.utf16();

            REHASH(foldCase(haystack, haystack_start));
            ++haystack;
        }
    }
    return -1;
}